

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerHeuristic.cpp
# Opt level: O2

void __thiscall Memory::RecyclerHeuristic::RecyclerHeuristic(RecyclerHeuristic *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint baseFactor;
  undefined8 *in_FS_OFFSET;
  undefined8 uVar5;
  undefined1 local_58 [8];
  MEMORYSTATUSEX mem;
  
  local_58._0_4_ = 0x40;
  BVar4 = GlobalMemoryStatusEx((LPMEMORYSTATUSEX)local_58);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerHeuristic.cpp"
                       ,0x1e,"(isSuccess)","isSuccess");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  else {
    bVar3 = AutoSystemInfo::IsLowMemoryDevice();
    if (bVar3 && (ulong)mem._0_8_ < 0x20000001) {
      uVar5 = 0x100000000020;
      baseFactor = 0x10;
      goto LAB_002a3a69;
    }
    if ((ulong)mem._0_8_ < 0x40000001) {
      uVar5 = 0x400000000040;
      baseFactor = 0x40;
      goto LAB_002a3a69;
    }
  }
  uVar5 = 0x2000000000100;
  baseFactor = 0xc0;
LAB_002a3a69:
  this->DefaultMaxAllocPageCount = (int)uVar5;
  this->DefaultMaxFreePageCount = (int)((ulong)uVar5 >> 0x20);
  ConfigureBaseFactor(this,baseFactor);
  return;
}

Assistant:

RecyclerHeuristic::RecyclerHeuristic()
{
    ::MEMORYSTATUSEX mem;
    mem.dwLength = sizeof(mem);
    BOOL isSuccess = ::GlobalMemoryStatusEx(&mem);
    Assert(isSuccess);

    DWORDLONG physicalMemoryBytes = mem.ullTotalPhys;
    uint baseFactor;

    // xplat-todo: Android sysconf is rather unreliable,
    // ullTotalPhys may not be the best source for a decision below
    if (isSuccess && AutoSystemInfo::IsLowMemoryDevice() && physicalMemoryBytes <= 512 MEGABYTES)
    {
        // Low-end Apollo (512MB RAM) scenario.
        // Note that what's specific about Apollo is that IE runs in physical memory,
        //      that's one reason to distinguish 512MB Apollo from 512MB desktop.
        baseFactor = 16;
        this->DefaultMaxFreePageCount = 16 MEGABYTES_OF_PAGES;
        this->DefaultMaxAllocPageCount = 32;
    }
    else if (isSuccess && physicalMemoryBytes <= 1024 MEGABYTES)
    {
        // Tablet/slate/high-end Apollo scenario, including 512MB non-Apollo.
        baseFactor = 64;
        this->DefaultMaxFreePageCount = 64 MEGABYTES_OF_PAGES;
        this->DefaultMaxAllocPageCount = 64;
    }
    else
    {
        // Regular desktop scenario.
        baseFactor = 192;
        this->DefaultMaxFreePageCount = 512 MEGABYTES_OF_PAGES;
        this->DefaultMaxAllocPageCount = 256;
    }

    this->ConfigureBaseFactor(baseFactor);
}